

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

int poptGetNextOpt(poptContext con)

{
  char cVar1;
  char cVar2;
  pbm_set *ppVar3;
  poptItem ppVar4;
  char **ppcVar5;
  optionStackEntry *poVar6;
  poptBits *bitsp;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  __gid_t __gid;
  __uid_t __uid;
  poptOption *ppVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  longlong aLong;
  int *piVar15;
  poptArgv ppcVar16;
  poptString pcVar17;
  poptOption *ppVar18;
  size_t sVar19;
  char *pcVar20;
  poptOption *extraout_RAX;
  poptOption *extraout_RAX_00;
  poptOption *ppVar21;
  int iVar22;
  uint uVar23;
  poptOption *ppVar24;
  size_t longNameLen;
  char *__s;
  poptOption *in_RSI;
  poptOption *ppVar25;
  poptContext ppVar26;
  poptContext con_00;
  long aLong_00;
  int iVar27;
  char *pcVar28;
  bool bVar29;
  poptBits ppVar30;
  double dVar31;
  void *cbData;
  poptCallbackType cb;
  int local_78;
  int local_70;
  char *local_58;
  poptContext local_50;
  void *local_48;
  poptCallbackType local_40;
  poptOption *local_38;
  
  if (con == (poptContext)0x0) {
    return -1;
  }
  ppVar21 = (poptOption *)0x0;
  bVar8 = false;
  local_50 = con;
LAB_0010350c:
  local_40 = (poptCallbackType)0x0;
  local_48 = (void *)0x0;
  ppVar26 = (poptContext)con->os;
  pcVar12 = ppVar26->optionStack[0].nextCharArg;
LAB_00103524:
  bVar29 = pcVar12 == (char *)0x0;
  if (bVar29) {
    if ((con < ppVar26) && (ppVar26->optionStack[0].next == ppVar26->optionStack[0].argc))
    goto code_r0x0010353d;
    if (bVar29) {
      if (ppVar26->optionStack[0].next == ppVar26->optionStack[0].argc) {
        ppVar25 = con->options;
        invokeCallbacksPOST(con,ppVar25);
        if (con->maincall != (_func_int_int_char_ptr_ptr *)0x0) {
          ppVar25 = (poptOption *)con->finalArgv;
          (*con->maincall)(con->finalArgvCount,(char **)ppVar25);
          uVar23 = 1;
          local_70 = -1;
          goto LAB_00104082;
        }
        ppVar4 = con->doExec;
        uVar23 = 1;
        if (ppVar4 == (poptItem)0x0) {
          local_70 = -1;
          goto LAB_00104082;
        }
        ppcVar5 = ppVar4->argv;
        local_70 = -10;
        if ((ppcVar5 == (char **)0x0) || (iVar27 = ppVar4->argc, (long)iVar27 < 1))
        goto LAB_00104082;
        if (con->execAbsolute == 0) {
          ppVar25 = (poptOption *)0x2f;
          pcVar12 = strchr(*ppcVar5,0x2f);
          if (pcVar12 != (char *)0x0) goto LAB_00104082;
        }
        ppVar11 = (poptOption *)
                  malloc(((long)iVar27 + (long)con->finalArgvCount + (long)con->numLeftovers) * 8 +
                         0x30);
        if (ppVar11 == (poptOption *)0x0) {
          local_70 = -0x15;
          goto LAB_00104082;
        }
        ppVar25 = (poptOption *)*ppcVar5;
        in_RSI = (poptOption *)0x2f;
        pcVar12 = strchr((char *)ppVar25,0x2f);
        if ((pcVar12 == (char *)0x0) && (pcVar12 = con->execPath, pcVar12 != (char *)0x0)) {
          sVar13 = strlen(pcVar12);
          sVar19 = strlen((char *)ppVar25);
          pcVar14 = (char *)malloc(sVar19 + sVar13 + 2);
          if (pcVar14 != (char *)0x0) {
            pcVar12 = stpcpy(pcVar14,pcVar12);
            pcVar12[0] = '/';
            pcVar12[1] = '\0';
            in_RSI = (poptOption *)*ppVar4->argv;
            strcpy(pcVar12 + 1,(char *)in_RSI);
          }
          goto LAB_00104146;
        }
        if (ppVar25 == (poptOption *)0x0) {
          pcVar14 = (char *)0x0;
          goto LAB_00104146;
        }
        in_RSI = (poptOption *)0x2f;
        pcVar12 = strchr((char *)ppVar25,0x2f);
        if (pcVar12 != (char *)0x0) {
          sVar13 = strlen((char *)ppVar25);
          con_00 = (poptContext)(sVar13 + 1);
          pcVar14 = (char *)malloc((size_t)con_00);
          if (pcVar14 == (char *)0x0) goto LAB_00104504;
          strcpy(pcVar14,(char *)ppVar25);
          in_RSI = ppVar25;
          goto LAB_00104146;
        }
        ppVar18 = (poptOption *)getenv("PATH");
        if (ppVar18 == (poptOption *)0x0) {
          pcVar14 = (char *)0x0;
          goto LAB_00104146;
        }
        sVar13 = strlen((char *)ppVar18);
        con_00 = (poptContext)(sVar13 + 1);
        pcVar12 = (char *)malloc((size_t)con_00);
        ppVar24 = in_RSI;
        if (pcVar12 == (char *)0x0) goto LAB_00104509;
        strcpy(pcVar12,(char *)ppVar18);
        sVar13 = strlen(pcVar12);
        sVar19 = strlen((char *)ppVar25);
        pcVar14 = (char *)malloc(sVar19 + sVar13 + 2);
        pcVar28 = pcVar12;
        if (pcVar14 == (char *)0x0) goto LAB_00104391;
        goto LAB_001042f7;
      }
      if (bVar29) {
        ppVar3 = ppVar26->optionStack[0].argb;
        if ((ppVar3 == (pbm_set *)0x0) ||
           (uVar23 = ppVar26->optionStack[0].next,
           (ppVar3[(ulong)(long)(int)uVar23 >> 5].bits[0] >> (uVar23 & 0x1f) & 1) == 0)) {
          iVar27 = ppVar26->optionStack[0].next;
          ppcVar16 = ppVar26->optionStack[0].argv;
          if (ppcVar16 == (poptArgv)0x0) {
            ppVar25 = (poptOption *)0x0;
          }
          else {
            ppVar26->optionStack[0].next = iVar27 + 1;
            ppVar25 = (poptOption *)ppcVar16[iVar27];
          }
          uVar23 = 1;
          if (ppVar25 == (poptOption *)0x0) {
            local_70 = -0xb;
            goto LAB_00103c4b;
          }
          if (((con->restLeftover == 0) && (*(char *)&ppVar25->longName == '-')) &&
             (cVar1 = *(char *)((long)&ppVar25->longName + 1), cVar1 != '\0')) {
            uVar23 = 0x80000000;
            if ((cVar1 == '-') && (uVar23 = 0, *(char *)((long)&ppVar25->longName + 2) == '\0')) {
              con->restLeftover = 1;
              goto LAB_001035e5;
            }
            ppVar11 = (poptOption *)((long)&ppVar25->longName + 1);
            ppVar25 = (poptOption *)((long)&ppVar25->longName + 2);
            if (cVar1 != '-') {
              ppVar25 = ppVar11;
            }
            for (longNameLen = 0;
                (cVar2 = *(char *)((long)&ppVar25->longName + longNameLen), cVar2 != '\0' &&
                (cVar2 != '=')); longNameLen = longNameLen + 1) {
            }
            in_RSI = (poptOption *)((long)&ppVar25->longName + longNameLen + 1);
            if (cVar2 != '=') {
              in_RSI = (poptOption *)0x0;
            }
            ppVar18 = ppVar25;
            local_38 = (poptOption *)(long)iVar27;
            iVar27 = handleAlias(con,(char *)ppVar25,longNameLen,'\0',(char *)in_RSI);
            if (iVar27 == 0) {
              ppVar18 = ppVar25;
              iVar27 = handleExec(con,(char *)ppVar25,'\0');
              if (iVar27 == 0) {
                ppVar21 = findOption(con->options,(char *)ppVar25,longNameLen,'\0',&local_40,
                                     &local_48,uVar23);
                con = local_50;
                if (cVar1 != '-' || ppVar21 != (poptOption *)0x0) {
                  bVar29 = true;
                  uVar23 = 0;
                  goto LAB_00104444;
                }
                local_70 = -0xb;
                uVar23 = 1;
                ppVar21 = (poptOption *)0x0;
              }
              else {
                uVar23 = 2;
                ppVar25 = ppVar18;
              }
              bVar29 = false;
            }
            else {
              in_RSI = (poptOption *)0x0;
              bVar29 = false;
              uVar23 = 2;
              ppVar25 = ppVar18;
            }
LAB_00104444:
            bVar7 = false;
            if (bVar29) {
              if (ppVar21 == (poptOption *)0x0) {
                ((poptContext)con->os)->optionStack[0].nextCharArg = (char *)ppVar11;
                in_RSI = (poptOption *)0x0;
                bVar7 = false;
                uVar23 = 0;
              }
              else {
                uVar23 = 0;
                if (((poptContext)con->os == con) && ((ppVar21->argInfo & 0x20000000) != 0)) {
                  ppVar25 = local_38;
                  poptStripArg(con,(int)local_38);
                  bVar7 = true;
                }
                else {
LAB_00103c4e:
                  bVar7 = false;
                }
              }
            }
LAB_00103c50:
            iVar27 = local_70;
            if (uVar23 == 0) goto LAB_001035f4;
            goto LAB_00104082;
          }
          if ((con->flags & 4) != 0) {
            con->restLeftover = 1;
          }
          if ((con->flags & 0x10) != 0) {
            sVar13 = strlen((char *)ppVar25);
            con_00 = (poptContext)(sVar13 + 1);
            pcVar12 = (char *)malloc((size_t)con_00);
            if (pcVar12 == (char *)0x0) goto LAB_001044f5;
            strcpy(pcVar12,(char *)ppVar25);
            ppVar26->optionStack[0].nextArg = pcVar12;
            in_RSI = (poptOption *)0x0;
            bVar7 = false;
            local_70 = 0;
            goto LAB_00103c50;
          }
          uVar23 = 2;
          if (con->leftovers == (poptArgv)0x0) goto LAB_00103c4b;
          iVar27 = con->allocLeftovers;
          if (iVar27 <= con->numLeftovers + 1) {
            con->allocLeftovers = iVar27 + 10;
            in_RSI = (poptOption *)((long)iVar27 * 8 + 0x50);
            ppcVar16 = (poptArgv)realloc(con->leftovers,(size_t)in_RSI);
            con->leftovers = ppcVar16;
          }
          sVar13 = strlen((char *)ppVar25);
          con_00 = (poptContext)(sVar13 + 1);
          pcVar12 = (char *)malloc((size_t)con_00);
          if (pcVar12 == (char *)0x0) goto LAB_001044ff;
          strcpy(pcVar12,(char *)ppVar25);
          iVar27 = con->numLeftovers;
          con->numLeftovers = iVar27 + 1;
          con->leftovers[iVar27] = pcVar12;
          in_RSI = ppVar25;
        }
        else {
          ppVar26->optionStack[0].next = uVar23 + 1;
LAB_001035e5:
          uVar23 = 2;
        }
LAB_00103c4b:
        ppVar25 = in_RSI;
        in_RSI = (poptOption *)0x0;
        goto LAB_00103c4e;
      }
    }
  }
  bVar7 = false;
  ppVar25 = in_RSI;
  in_RSI = (poptOption *)0x0;
  iVar27 = local_70;
LAB_001035f4:
  pcVar12 = con->os->nextCharArg;
  if (pcVar12 == (char *)0x0) {
    local_78 = 0;
LAB_00103814:
    uVar23 = 1;
    if (ppVar21 == (poptOption *)0x0) {
      ppVar21 = (poptOption *)0x0;
      local_70 = -0xb;
      goto LAB_00104082;
    }
    uVar10 = _poptArgMask & ppVar21->argInfo;
    if ((uVar10 == 7) || (uVar10 == 0)) {
      if ((in_RSI != (poptOption *)0x0) ||
         ((pcVar12 = con->os->nextCharArg, pcVar12 != (char *)0x0 && (*pcVar12 == '=')))) {
        local_70 = -0xc;
        goto LAB_00104082;
      }
      piVar15 = (int *)ppVar21->arg;
      in_RSI = ppVar25;
      if (piVar15 != (int *)0x0) {
        aLong_00 = 1;
        if (uVar10 == 7) {
          aLong_00 = (long)ppVar21->val;
        }
        uVar10 = poptArgInfo(con,ppVar21);
        in_RSI = (poptOption *)(ulong)uVar10;
        iVar9 = poptSaveInt(piVar15,uVar10,aLong_00);
        ppVar25 = in_RSI;
        local_70 = -0x13;
        if (iVar9 != 0) goto LAB_00104082;
      }
    }
    else {
      pcVar12 = con->os->nextArg;
      if (pcVar12 != (char *)0x0) {
        free(pcVar12);
      }
      poVar6 = con->os;
      poVar6->nextArg = (char *)0x0;
      if (in_RSI == (poptOption *)0x0) {
        pcVar12 = poVar6->nextCharArg;
        if (pcVar12 != (char *)0x0) {
          in_RSI = (poptOption *)(pcVar12 + (*pcVar12 == '='));
          pcVar12 = expandNextArg(con,(char *)in_RSI);
          poVar6 = con->os;
          poVar6->nextArg = pcVar12;
          poVar6->nextCharArg = (char *)0x0;
          goto LAB_00103938;
        }
        ppVar26 = (poptContext)con->os;
        uVar23 = ppVar26->optionStack[0].next;
        in_RSI = (poptOption *)(ulong)uVar23;
        bVar29 = uVar23 == ppVar26->optionStack[0].argc;
        if (con < ppVar26 && bVar29) {
          do {
            con->os = (optionStackEntry *)&ppVar26[-1].finalArgv;
            cleanOSE(ppVar26->optionStack);
            ppVar26 = (poptContext)con->os;
            uVar23 = ppVar26->optionStack[0].argc;
            uVar10 = ppVar26->optionStack[0].next;
            in_RSI = (poptOption *)(ulong)uVar10;
            bVar29 = uVar10 == uVar23;
            if (ppVar26 <= con) break;
          } while (uVar10 == uVar23);
        }
        if (!bVar29) {
          if (((ppVar26 == con) && (bVar7)) && ((ppVar21->argInfo & 0x20000000) != 0)) {
            poptStripArg(con,(int)in_RSI);
          }
          poVar6 = con->os;
          ppcVar16 = poVar6->argv;
          if (ppcVar16 != (poptArgv)0x0) {
            if (((ppVar21->argInfo & 0x10000000) == 0) || (*ppcVar16[poVar6->next] != '-')) {
              iVar9 = poVar6->next;
              poVar6->next = iVar9 + 1;
              in_RSI = (poptOption *)ppcVar16[iVar9];
              goto LAB_00103889;
            }
            poVar6->nextArg = (char *)0x0;
          }
          goto LAB_00103938;
        }
        if ((ppVar21->argInfo & 0x10000000) != 0) {
          ppVar26->optionStack[0].nextArg = (char *)0x0;
          goto LAB_00103938;
        }
        iVar27 = -10;
        bVar29 = false;
      }
      else {
LAB_00103889:
        pcVar12 = expandNextArg(con,(char *)in_RSI);
        con->os->nextArg = pcVar12;
LAB_00103938:
        bitsp = (poptBits *)ppVar21->arg;
        if (bitsp != (poptBits *)0x0) {
          uVar23 = _poptArgMask & ppVar21->argInfo;
          switch(uVar23) {
          case 1:
            ppVar25 = (poptOption *)con->os->nextArg;
            if (ppVar25 == (poptOption *)0x0) {
              ppVar30 = (poptBits)0x0;
LAB_00103e59:
              *bitsp = ppVar30;
LAB_00103e5d:
              iVar9 = 0;
              break;
            }
            sVar13 = strlen((char *)ppVar25);
            con_00 = (poptContext)(sVar13 + 1);
            ppVar30 = (poptBits)malloc((size_t)con_00);
            if (ppVar30 != (poptBits)0x0) {
              strcpy((char *)ppVar30,(char *)ppVar25);
              in_RSI = ppVar25;
              goto LAB_00103e59;
            }
            goto LAB_001044fa;
          case 2:
          case 3:
          case 10:
          case 0xd:
            in_RSI = ppVar21;
            uVar23 = poptArgInfo(con,ppVar21);
            ppVar25 = (poptOption *)(ulong)uVar23;
            pcVar12 = con->os->nextArg;
            if (pcVar12 == (char *)0x0) {
              aLong = 0;
              iVar9 = 0;
            }
            else {
              local_58 = (char *)0x0;
              in_RSI = (poptOption *)&local_58;
              aLong = strtoll(pcVar12,(char **)in_RSI,0);
              if (local_58 == (char *)0x0) {
                iVar9 = -0x11;
              }
              else {
                iVar9 = -0x11;
                if (*local_58 == '\0') {
                  iVar9 = 0;
                }
              }
            }
            if (iVar9 == 0) {
              uVar10 = _poptArgMask & ppVar21->argInfo;
              iVar9 = 0;
              if ((int)uVar10 < 10) {
                if (uVar10 == 2) {
                  iVar9 = -0x12;
                  if ((int)aLong == aLong) {
                    iVar9 = poptSaveInt((int *)bitsp,uVar23,aLong);
                    in_RSI = ppVar25;
                  }
                }
                else if (uVar10 == 3) {
                  iVar9 = poptSaveLong((long *)bitsp,uVar23,aLong);
                  in_RSI = ppVar25;
                }
              }
              else if (uVar10 == 0xd) {
                iVar9 = -0x12;
                if ((short)aLong == aLong) {
                  iVar9 = poptSaveShort((short *)bitsp,uVar23,aLong);
                  in_RSI = ppVar25;
                }
              }
              else if ((uVar10 == 10) && (iVar9 = -0x12, 1 < aLong + 0x8000000000000001U)) {
                iVar9 = poptSaveLongLong((longlong *)bitsp,uVar23,aLong);
                in_RSI = ppVar25;
              }
            }
            break;
          case 4:
          case 5:
          case 6:
          case 7:
          case 0xb:
switchD_0010396c_caseD_4:
            fprintf(_stdout,"option type (%u) not implemented in popt\n");
            exit(1);
          case 8:
          case 9:
            local_58 = (char *)0x0;
            pcVar12 = con->os->nextArg;
            if (pcVar12 == (char *)0x0) {
              iVar22 = 0;
              ppVar30 = (poptBits)0x0;
            }
            else {
              piVar15 = __errno_location();
              iVar9 = *piVar15;
              *piVar15 = 0;
              in_RSI = (poptOption *)&local_58;
              ppVar30 = (poptBits)strtod(pcVar12,(char **)in_RSI);
              if (*piVar15 == 0x22) {
                iVar22 = -0x12;
                bVar29 = false;
              }
              else {
                *piVar15 = iVar9;
                bVar29 = *local_58 == '\0';
                iVar22 = -0x11;
                if (bVar29) {
                  iVar22 = 0;
                }
              }
              iVar9 = iVar22;
              if (!bVar29) break;
            }
            uVar23 = _poptArgMask & ppVar21->argInfo;
            iVar9 = iVar22;
            if (uVar23 == 8) {
              dVar31 = (double)(~-(ulong)((double)ppVar30 < 2.220446049250313e-16) & (ulong)ppVar30
                               | ((ulong)ppVar30 ^ 0x8000000000000000) &
                                 -(ulong)((double)ppVar30 < 2.220446049250313e-16));
              iVar9 = -0x12;
              if ((1.1754943508222875e-38 - dVar31 <= 2.220446049250313e-16) &&
                 (dVar31 + -3.4028234663852886e+38 <= 2.220446049250313e-16)) {
                *(float *)bitsp = (float)(double)ppVar30;
                iVar9 = iVar22;
              }
            }
            else if (uVar23 == 9) {
              *bitsp = ppVar30;
            }
            break;
          case 0xc:
            iVar9 = poptSaveString((char ***)bitsp,(uint)in_RSI,con->os->nextArg);
            break;
          default:
            if (uVar23 == 0x1b) {
              con->maincall = (_func_int_int_char_ptr_ptr *)bitsp;
              goto LAB_00103e5d;
            }
            if (uVar23 != 0x1e) goto switchD_0010396c_caseD_4;
            iVar9 = poptSaveBits(bitsp,(uint)in_RSI,con->os->nextArg);
          }
          if (iVar9 != 0) {
            bVar29 = false;
            iVar27 = iVar9;
            goto LAB_00103e6d;
          }
        }
        bVar29 = true;
      }
LAB_00103e6d:
      uVar23 = 1;
      ppVar25 = in_RSI;
      local_70 = iVar27;
      if (!bVar29) goto LAB_00104082;
    }
    if (local_40 == (poptCallbackType)0x0) {
      if ((ppVar21->val != 0) && ((_poptArgMask & ppVar21->argInfo) != 7)) {
        bVar8 = true;
      }
    }
    else {
      in_RSI = con->options;
      invokeCallbacksOPTION(con,in_RSI,ppVar21,local_48,local_78);
    }
    iVar9 = con->finalArgvAlloced;
    if (iVar9 <= con->finalArgvCount + 2) {
      con->finalArgvAlloced = iVar9 + 10;
      in_RSI = (poptOption *)((long)iVar9 * 8 + 0x50);
      ppcVar16 = (poptArgv)realloc(con->finalArgv,(size_t)in_RSI);
      con->finalArgv = ppcVar16;
    }
    ppcVar16 = con->finalArgv;
    if (ppcVar16 != (poptArgv)0x0) {
      if (ppVar21->longName == (char *)0x0) {
        sVar13 = 3;
      }
      else {
        sVar13 = strlen(ppVar21->longName);
        sVar13 = sVar13 + 3;
      }
      pcVar17 = (poptString)malloc(sVar13);
      iVar9 = con->finalArgvCount;
      con->finalArgvCount = iVar9 + 1;
      if (pcVar17 == (poptString)0x0) {
        ppcVar16[iVar9] = (poptString)0x0;
      }
      else {
        ppcVar16[iVar9] = pcVar17;
        *pcVar17 = '-';
        if (ppVar21->longName == (char *)0x0) {
          pcVar17[1] = ppVar21->shortName;
          pcVar17[2] = '\0';
        }
        else {
          if ((int)ppVar21->argInfo < 0) {
            pcVar12 = pcVar17 + 1;
          }
          else {
            pcVar17[1] = '-';
            pcVar12 = pcVar17 + 2;
          }
          in_RSI = (poptOption *)ppVar21->longName;
          strcpy(pcVar12,(char *)in_RSI);
        }
      }
    }
    ppVar25 = in_RSI;
    local_70 = iVar27;
    if ((ppVar21->arg == (void *)0x0) || ((ppVar21->argInfo & _poptArgMask) != 0)) {
      uVar23 = 0;
      uVar10 = _poptArgMask & ppVar21->argInfo;
      if ((uVar10 != 0) &&
         (((uVar10 != 7 && (ppcVar16 = con->finalArgv, ppcVar16 != (poptArgv)0x0)) &&
          (ppVar11 = (poptOption *)con->os->nextArg, ppVar11 != (poptOption *)0x0)))) {
        sVar13 = strlen((char *)ppVar11);
        con_00 = (poptContext)(sVar13 + 1);
        pcVar12 = (char *)malloc((size_t)con_00);
        if (pcVar12 == (char *)0x0) {
          poptGetNextOpt_cold_4();
LAB_001044f5:
          poptGetNextOpt_cold_1();
LAB_001044fa:
          poptGetNextOpt_cold_3();
LAB_001044ff:
          poptGetNextOpt_cold_2();
LAB_00104504:
          poptGetNextOpt_cold_5();
          ppVar24 = in_RSI;
LAB_00104509:
          poptGetNextOpt_cold_6();
          goto LAB_0010450e;
        }
        strcpy(pcVar12,(char *)ppVar11);
        iVar27 = con->finalArgvCount;
        con->finalArgvCount = iVar27 + 1;
        ppcVar16[iVar27] = pcVar12;
        ppVar25 = ppVar11;
      }
    }
    else {
      uVar23 = 0;
    }
  }
  else {
    con->os->nextCharArg = (char *)0x0;
    pcVar14 = pcVar12 + 1;
    ppVar25 = (poptOption *)0x0;
    iVar9 = handleAlias(con,(char *)0x0,0,*pcVar12,pcVar14);
    if (iVar9 == 0) {
      ppVar25 = (poptOption *)0x0;
      iVar9 = handleExec(con,(char *)0x0,*pcVar12);
      bVar29 = iVar9 == 0;
      if (bVar29) {
        ppVar25 = (poptOption *)0x0;
        ppVar21 = findOption(con->options,(char *)0x0,0,*pcVar12,&local_40,&local_48,0);
        if (ppVar21 == (poptOption *)0x0) {
          local_78 = 0;
          iVar27 = -0xb;
          uVar23 = 1;
          bVar29 = false;
          ppVar21 = (poptOption *)0x0;
        }
        else {
          uVar23 = 0;
          local_78 = 1;
          if (*pcVar14 != '\0') goto LAB_001036c4;
          bVar29 = true;
        }
      }
      else {
        local_78 = 0;
        if (*pcVar14 == '\0') goto LAB_0010363d;
LAB_001036c4:
        uVar23 = 0;
        local_50->os->nextCharArg = pcVar14;
      }
    }
    else {
LAB_0010363d:
      local_78 = 0;
      uVar23 = 0;
      bVar29 = false;
    }
    con = local_50;
    local_70 = iVar27;
    if (bVar29) goto LAB_00103814;
  }
  goto LAB_00104082;
code_r0x0010353d:
  con->os = (optionStackEntry *)&ppVar26[-1].finalArgv;
  cleanOSE(ppVar26->optionStack);
  ppVar26 = (poptContext)con->os;
  pcVar12 = ppVar26->optionStack[0].nextCharArg;
  goto LAB_00103524;
  while( true ) {
    pcVar20 = strchr(__s,0x3a);
    if (pcVar20 == (char *)0x0) {
      pcVar28 = (char *)0x0;
    }
    else {
      pcVar28 = pcVar20 + 1;
      *pcVar20 = '\0';
    }
    pcVar20 = stpcpy(pcVar14,__s);
    pcVar20[0] = '/';
    pcVar20[1] = '\0';
    strcpy(pcVar20 + 1,(char *)ppVar25);
    ppVar18 = (poptOption *)0x1;
    iVar27 = access(pcVar14,1);
    if (iVar27 == 0) break;
LAB_001042f7:
    __s = pcVar28;
    if (__s == (char *)0x0) goto LAB_00104391;
    if (*__s == '\0') break;
  }
LAB_00104393:
  if (__s == (char *)0x0) {
    if (pcVar14 != (char *)0x0) goto LAB_00104411;
  }
  else {
    if ((pcVar14 == (char *)0x0) || (*__s != '\0')) goto LAB_0010441c;
LAB_00104411:
    free(pcVar14);
  }
  pcVar14 = (char *)0x0;
LAB_0010441c:
  free(pcVar12);
  in_RSI = ppVar18;
LAB_00104146:
  uVar23 = 1;
  ppVar11->longName = pcVar14;
  if (pcVar14 == (char *)0x0) {
    local_70 = -10;
  }
  else {
    iVar27 = 1;
    if (1 < ppVar4->argc) {
      memcpy(&ppVar11->shortName,ppVar4->argv + 1,(ulong)(ppVar4->argc - 1) << 3);
      iVar27 = ppVar4->argc;
    }
    if (con->finalArgv != (poptArgv)0x0) {
      iVar9 = con->finalArgvCount;
      if (0 < (long)iVar9) {
        memcpy(&ppVar11->longName + iVar27,con->finalArgv,(long)iVar9 << 3);
        iVar27 = iVar27 + iVar9;
      }
    }
    in_RSI = (poptOption *)con->leftovers;
    if (in_RSI != (poptOption *)0x0) {
      iVar9 = con->numLeftovers;
      if (0 < (long)iVar9) {
        memcpy(&ppVar11->longName + iVar27,in_RSI,(long)iVar9 << 3);
        iVar27 = iVar27 + iVar9;
      }
    }
    (&ppVar11->longName)[iVar27] = (char *)0x0;
    __gid = getgid();
    iVar27 = setgid(__gid);
    local_70 = -0x10;
    if (iVar27 == 0) {
      __uid = getuid();
      iVar27 = setuid(__uid);
      if (iVar27 == 0) {
        ppVar24 = ppVar11;
        execvp(ppVar11->longName,(char **)ppVar11);
        in_RSI = (poptOption *)ppVar11->longName;
        sVar13 = strlen((char *)in_RSI);
        con_00 = (poptContext)(sVar13 + 1);
        pcVar12 = (char *)malloc((size_t)con_00);
        if (pcVar12 == (char *)0x0) {
LAB_0010450e:
          poptGetNextOpt_cold_7();
          iVar27 = (int)extraout_RAX;
          ppVar21 = extraout_RAX;
          if (ppVar24 != (poptOption *)0x0) {
            for (; ((iVar27 = (int)ppVar21, ppVar24->longName != (char *)0x0 ||
                    (ppVar24->shortName != '\0')) || (ppVar24->arg != (void *)0x0));
                ppVar24 = ppVar24 + 1) {
              ppVar21 = (poptOption *)ppVar24->arg;
              if (ppVar21 != (poptOption *)0x0) {
                uVar23 = _poptArgMask & ppVar24->argInfo;
                if (uVar23 == 5) {
                  if ((ppVar24->argInfo >> 0x1e & 1) != 0) {
                    ppVar21 = (poptOption *)(*(code *)ppVar21)(con_00,1,0,0,ppVar24->descrip);
                  }
                }
                else if (uVar23 == 4) {
                  if (ppVar21 == poptHelpOptions) {
                    ppVar21 = poptHelpOptionsI18N;
                  }
                  invokeCallbacksPOST(con_00,ppVar21);
                  ppVar21 = extraout_RAX_00;
                }
              }
            }
          }
          return iVar27;
        }
        strcpy(pcVar12,(char *)in_RSI);
        con->execFail = pcVar12;
      }
    }
  }
  if (ppVar11->longName != (char *)0x0) {
    free(ppVar11->longName);
  }
  free(ppVar11);
  ppVar25 = in_RSI;
LAB_00104082:
  if ((uVar23 & 1) != 0) {
    return local_70;
  }
  in_RSI = ppVar25;
  if (bVar8) {
    if (ppVar21 == (poptOption *)0x0) {
      return -1;
    }
    return ppVar21->val;
  }
  goto LAB_0010350c;
LAB_00104391:
  __s = (char *)0x0;
  goto LAB_00104393;
}

Assistant:

int poptGetNextOpt(poptContext con)
{
    const struct poptOption * opt = NULL;
    int done = 0;

    if (con == NULL)
	return -1;
    while (!done) {
	const char * origOptString = NULL;
	poptCallbackType cb = NULL;
	const void * cbData = NULL;
	const char * longArg = NULL;
	int canstrip = 0;
	int shorty = 0;

	while (!con->os->nextCharArg && con->os->next == con->os->argc
		&& con->os > con->optionStack) {
	    cleanOSE(con->os--);
	}
	if (!con->os->nextCharArg && con->os->next == con->os->argc) {
	    invokeCallbacksPOST(con, con->options);

	    if (con->maincall) {
		(void) (*con->maincall) (con->finalArgvCount, con->finalArgv);
		return -1;
	    }

	    if (con->doExec) return execCommand(con);
	    return -1;
	}

	/* Process next long option */
	if (!con->os->nextCharArg) {
	    const char * optString;
            size_t optStringLen;
	    int thisopt;

	    if (con->os->argb && PBM_ISSET(con->os->next, con->os->argb)) {
		con->os->next++;
		continue;
	    }
	    thisopt = con->os->next;
	    if (con->os->argv != NULL)	/* XXX can't happen */
	    origOptString = con->os->argv[con->os->next++];

	    if (origOptString == NULL)	/* XXX can't happen */
		return POPT_ERROR_BADOPT;

	    if (con->restLeftover || *origOptString != '-' ||
		(*origOptString == '-' && origOptString[1] == '\0'))
	    {
		if (con->flags & POPT_CONTEXT_POSIXMEHARDER)
		    con->restLeftover = 1;
		if (con->flags & POPT_CONTEXT_ARG_OPTS) {
		    con->os->nextArg = xstrdup(origOptString);
		    return 0;
		}
		if (con->leftovers != NULL) {	/* XXX can't happen */
		    /* One might think we can never overflow the leftovers
		       array.  Actually, that's true, as long as you don't
		       use poptStuffArgs()... */
		    if ((con->numLeftovers + 1) >= (con->allocLeftovers)) {
			con->allocLeftovers += 10;
			con->leftovers =
			    realloc(con->leftovers,
				    sizeof(*con->leftovers) * con->allocLeftovers);
		    }
		    con->leftovers[con->numLeftovers++]
			= xstrdup(origOptString); /* so a free of a stuffed
						     argv doesn't give us a
						     dangling pointer */
		}
		continue;
	    }

	    /* Make a copy we can hack at */
	    optString = origOptString;

	    if (optString[0] == '\0')
		return POPT_ERROR_BADOPT;

	    if (optString[1] == '-' && !optString[2]) {
		con->restLeftover = 1;
		continue;
	    } else {
		const char *oe;
		unsigned int argInfo = 0;

		optString++;
		if (*optString == '-')
		    optString++;
		else
		    argInfo |= POPT_ARGFLAG_ONEDASH;

		/* Check for "--long=arg" option. */
		for (oe = optString; *oe && *oe != '='; oe++)
		    {};
		optStringLen = (size_t)(oe - optString);
		if (*oe == '=')
		    longArg = oe + 1;

		/* XXX aliases with arg substitution need "--alias=arg" */
		if (handleAlias(con, optString, optStringLen, '\0', longArg)) {
		    longArg = NULL;
		    continue;
		}

		if (handleExec(con, optString, '\0'))
		    continue;

		opt = findOption(con->options, optString, optStringLen, '\0', &cb, &cbData,
				 argInfo);
		if (!opt && !LF_ISSET(ONEDASH))
		    return POPT_ERROR_BADOPT;
	    }

	    if (!opt) {
		con->os->nextCharArg = origOptString + 1;
		longArg = NULL;
	    } else {
		if (con->os == con->optionStack && F_ISSET(opt, STRIP))
		{
		    canstrip = 1;
		    poptStripArg(con, thisopt);
		}
		shorty = 0;
	    }
	}

	/* Process next short option */
	if (con->os->nextCharArg) {
	    const char * nextCharArg = con->os->nextCharArg;

	    con->os->nextCharArg = NULL;

	    if (handleAlias(con, NULL, 0, *nextCharArg, nextCharArg + 1))
		continue;

	    if (handleExec(con, NULL, *nextCharArg)) {
		/* Restore rest of short options for further processing */
		nextCharArg++;
		if (*nextCharArg != '\0')
		    con->os->nextCharArg = nextCharArg;
		continue;
	    }

	    opt = findOption(con->options, NULL, 0, *nextCharArg, &cb,
			     &cbData, 0);
	    if (!opt)
		return POPT_ERROR_BADOPT;
	    shorty = 1;

	    nextCharArg++;
	    if (*nextCharArg != '\0')
		con->os->nextCharArg = nextCharArg;
	}

	if (opt == NULL) return POPT_ERROR_BADOPT;	/* XXX can't happen */
	if (poptArgType(opt) == POPT_ARG_NONE || poptArgType(opt) == POPT_ARG_VAL) {
	    if (longArg || (con->os->nextCharArg && con->os->nextCharArg[0] == '='))
		return POPT_ERROR_UNWANTEDARG;
	    if (opt->arg) {
		long val = poptArgType(opt) == POPT_ARG_VAL ? opt->val : 1;
		unsigned int argInfo = poptArgInfo(con, opt);
		if (poptSaveInt((int *)opt->arg, argInfo, val))
		    return POPT_ERROR_BADOPERATION;
	    }
	} else {
	    int rc;

	    con->os->nextArg = _free(con->os->nextArg);
	    if (longArg) {
		longArg = expandNextArg(con, longArg);
		con->os->nextArg = (char *) longArg;
	    } else if (con->os->nextCharArg) {
		longArg = expandNextArg(con, con->os->nextCharArg + (int)(*con->os->nextCharArg == '='));
		con->os->nextArg = (char *) longArg;
		con->os->nextCharArg = NULL;
	    } else {
		while (con->os->next == con->os->argc &&
			con->os > con->optionStack)
		{
		    cleanOSE(con->os--);
		}
		if (con->os->next == con->os->argc) {
		    if (!F_ISSET(opt, OPTIONAL))
			return POPT_ERROR_NOARG;
		    con->os->nextArg = NULL;
		} else {

		    /*
		     * Make sure this isn't part of a short arg or the
		     * result of an alias expansion.
		     */
		    if (con->os == con->optionStack
		     && F_ISSET(opt, STRIP) && canstrip)
		    {
			poptStripArg(con, con->os->next);
		    }
		
		    if (con->os->argv != NULL) {	/* XXX can't happen */
			if (F_ISSET(opt, OPTIONAL) &&
			    con->os->argv[con->os->next][0] == '-') {
			    con->os->nextArg = NULL;
			} else {
			    /* XXX watchout: subtle side-effects live here. */
			    longArg = con->os->argv[con->os->next++];
			    longArg = expandNextArg(con, longArg);
			    con->os->nextArg = (char *) longArg;
			}
		    }
		}
	    }
	    longArg = NULL;

	   /* Save the option argument through a (*opt->arg) pointer. */
	    if (opt->arg != NULL && (rc = poptSaveArg(con, opt)) != 0)
		return rc;
	}

	if (cb)
	    invokeCallbacksOPTION(con, con->options, opt, cbData, shorty);
	else if (opt->val && (poptArgType(opt) != POPT_ARG_VAL))
	    done = 1;

	if ((con->finalArgvCount + 2) >= (con->finalArgvAlloced)) {
	    con->finalArgvAlloced += 10;
	    con->finalArgv = realloc(con->finalArgv,
			    sizeof(*con->finalArgv) * con->finalArgvAlloced);
	}

	if (con->finalArgv != NULL)
	{   char *s = malloc((opt->longName ? strlen(opt->longName) : 0) + sizeof("--"));
	    if (s != NULL) {	/* XXX can't happen */
		con->finalArgv[con->finalArgvCount++] = s;
		*s++ = '-';
		if (opt->longName) {
		    if (!F_ISSET(opt, ONEDASH))
			*s++ = '-';
		    s = stpcpy(s, opt->longName);
		} else {
		    *s++ = opt->shortName;
		    *s = '\0';
		}
	    } else
		con->finalArgv[con->finalArgvCount++] = NULL;
	}

	if (opt->arg && poptArgType(opt) == POPT_ARG_NONE)
	    ;
	else if (poptArgType(opt) == POPT_ARG_VAL)
	    ;
	else if (poptArgType(opt) != POPT_ARG_NONE) {
	    if (con->finalArgv != NULL && con->os->nextArg != NULL)
	        con->finalArgv[con->finalArgvCount++] =
			xstrdup(con->os->nextArg);
	}
    }

    return (opt ? opt->val : -1);	/* XXX can't happen */
}